

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_codec.c
# Opt level: O0

BUFFER_HANDLE
mqtt_codec_subscribe
          (uint16_t packetId,SUBSCRIBE_PAYLOAD *subscribeList,size_t count,STRING_HANDLE trace_log)

{
  int iVar1;
  STRING_HANDLE local_38;
  STRING_HANDLE sub_trace;
  BUFFER_HANDLE result;
  STRING_HANDLE trace_log_local;
  size_t count_local;
  SUBSCRIBE_PAYLOAD *subscribeList_local;
  uint16_t packetId_local;
  
  if ((subscribeList == (SUBSCRIBE_PAYLOAD *)0x0) || (count == 0)) {
    sub_trace = (STRING_HANDLE)0x0;
  }
  else {
    sub_trace = (STRING_HANDLE)BUFFER_new();
    if ((BUFFER_HANDLE)sub_trace != (BUFFER_HANDLE)0x0) {
      iVar1 = constructSubscibeTypeVariableHeader((BUFFER_HANDLE)sub_trace,packetId);
      if (iVar1 == 0) {
        local_38 = (STRING_HANDLE)0x0;
        if (trace_log != (STRING_HANDLE)0x0) {
          local_38 = STRING_construct_sprintf(" | PACKET_ID: %u",(ulong)packetId);
        }
        iVar1 = addListItemsToSubscribePacket((BUFFER_HANDLE)sub_trace,subscribeList,count,local_38)
        ;
        if (iVar1 == 0) {
          if (trace_log != (STRING_HANDLE)0x0) {
            STRING_concat(trace_log,"SUBSCRIBE");
          }
          iVar1 = constructFixedHeader((BUFFER_HANDLE)sub_trace,SUBSCRIBE_TYPE,'\x02');
          if (iVar1 == 0) {
            if (trace_log != (STRING_HANDLE)0x0) {
              STRING_concat_with_STRING(trace_log,local_38);
            }
          }
          else {
            BUFFER_delete((BUFFER_HANDLE)sub_trace);
            sub_trace = (STRING_HANDLE)0x0;
          }
        }
        else {
          BUFFER_delete((BUFFER_HANDLE)sub_trace);
          sub_trace = (STRING_HANDLE)0x0;
        }
        if (local_38 != (STRING_HANDLE)0x0) {
          STRING_delete(local_38);
        }
      }
      else {
        BUFFER_delete((BUFFER_HANDLE)sub_trace);
        sub_trace = (STRING_HANDLE)0x0;
      }
    }
  }
  return (BUFFER_HANDLE)sub_trace;
}

Assistant:

BUFFER_HANDLE mqtt_codec_subscribe(uint16_t packetId, SUBSCRIBE_PAYLOAD* subscribeList, size_t count, STRING_HANDLE trace_log)
{
    BUFFER_HANDLE result;
    /* Codes_SRS_MQTT_CODEC_07_023: [If the parameters subscribeList is NULL or if count is 0 then mqtt_codec_subscribe shall return NULL.] */
    if (subscribeList == NULL || count == 0)
    {
        result = NULL;
    }
    else
    {
        /* Codes_SRS_MQTT_CODEC_07_026: [mqtt_codec_subscribe shall return a BUFFER_HANDLE that represents a MQTT SUBSCRIBE message.]*/
        result = BUFFER_new();
        if (result != NULL)
        {
            if (constructSubscibeTypeVariableHeader(result, packetId) != 0)
            {
                /* Codes_SRS_MQTT_CODEC_07_025: [If any error is encountered then mqtt_codec_subscribe shall return NULL.] */
                BUFFER_delete(result);
                result = NULL;
            }
            else
            {
                STRING_HANDLE sub_trace = NULL;
                if (trace_log != NULL)
                {
                    sub_trace = STRING_construct_sprintf(" | PACKET_ID: %"PRIu16, packetId);
                }
                /* Codes_SRS_MQTT_CODEC_07_024: [mqtt_codec_subscribe shall iterate through count items in the subscribeList.] */
                if (addListItemsToSubscribePacket(result, subscribeList, count, sub_trace) != 0)
                {
                    /* Codes_SRS_MQTT_CODEC_07_025: [If any error is encountered then mqtt_codec_subscribe shall return NULL.] */
                    BUFFER_delete(result);
                    result = NULL;
                }
                else
                {

                    if (trace_log != NULL)
                    {
                        STRING_concat(trace_log, "SUBSCRIBE");
                    }
                    if (constructFixedHeader(result, SUBSCRIBE_TYPE, SUBSCRIBE_FIXED_HEADER_FLAG) != 0)
                    {
                        /* Codes_SRS_MQTT_CODEC_07_025: [If any error is encountered then mqtt_codec_subscribe shall return NULL.] */
                        BUFFER_delete(result);
                        result = NULL;
                    }
                    else
                    {
                        if (trace_log != NULL)
                        {
                            (void)STRING_concat_with_STRING(trace_log, sub_trace);
                        }
                    }
                }
                if (sub_trace != NULL)
                {
                    STRING_delete(sub_trace);
                }
            }
        }
    }
    return result;
}